

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O1

bool crnlib::string_to_int64(char **pBuf,int64 *value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  
  *value = 0;
  pcVar9 = *pBuf;
  cVar6 = *pcVar9;
  while ((cVar6 != '\0' && (iVar2 = isspace((int)cVar6), iVar2 != 0))) {
    cVar6 = pcVar9[1];
    pcVar9 = pcVar9 + 1;
  }
  if ((int)cVar6 - 0x3aU < 0xfffffff6) {
    if (cVar6 != '-') {
      return false;
    }
    pcVar9 = pcVar9 + 1;
  }
  uVar5 = 0;
  while ((*pcVar9 != '\0' && (uVar7 = (int)*pcVar9 - 0x30, uVar7 < 10))) {
    if (uVar5 >> 0x3d != 0) {
      return false;
    }
    if (CARRY8(uVar5 * 8,uVar5 * 2)) {
      bVar1 = false;
    }
    else {
      uVar3 = (ulong)uVar7;
      uVar8 = ~(uVar5 * 10);
      uVar4 = uVar3;
      if (uVar8 < uVar3) {
        uVar4 = 0;
      }
      bVar1 = uVar3 <= uVar8;
      uVar5 = uVar4 + uVar5 * 10;
      pcVar9 = pcVar9 + bVar1;
    }
    if (!bVar1) {
      return false;
    }
  }
  if ((int)cVar6 - 0x3aU < 0xfffffff6) {
    if (uVar5 < 0x8000000000000001) {
      uVar5 = -uVar5;
LAB_00146984:
      *value = uVar5;
      *pBuf = pcVar9;
      return true;
    }
  }
  else if (-1 < (long)uVar5) goto LAB_00146984;
  *value = 0;
  return false;
}

Assistant:

bool string_to_int64(const char*& pBuf, int64& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint64 result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE000000000000000ULL)
            {
                return false;
            }

            const uint64 result8 = result << 3U;
            const uint64 result2 = result << 1U;

            if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFFFFFFFFFULL - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x8000000000000000ULL)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int64>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFFFFFFFFFULL)
            {
                value = 0;
                return false;
            }
            value = static_cast<int64>(result);
        }

        pBuf = p;

        return true;
    }